

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QWidget_*>::growAppend
          (QCommonArrayOps<QWidget_*> *this,QWidget **b,QWidget **e)

{
  QWidget **ppQVar1;
  QWidget ***data;
  QArrayDataPointer<QWidget_*> *old;
  long in_FS_OFFSET;
  QArrayDataPointer<QWidget_*> local_38;
  QWidget **local_20;
  long local_18;
  
  old = &local_38;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = b;
  if (b != e) {
    local_38.d = (Data *)0x0;
    local_38.ptr = (QWidget **)0x0;
    local_38.size = 0;
    ppQVar1 = (this->super_Type).super_QArrayDataPointer<QWidget_*>.ptr;
    if ((b < ppQVar1) || (ppQVar1 + (this->super_Type).super_QArrayDataPointer<QWidget_*>.size <= b)
       ) {
      data = (QWidget ***)0x0;
      old = (QArrayDataPointer<QWidget_*> *)0x0;
    }
    else {
      data = &local_20;
    }
    QArrayDataPointer<QWidget_*>::detachAndGrow
              ((QArrayDataPointer<QWidget_*> *)this,GrowsAtEnd,(long)e - (long)b >> 3,data,old);
    QPodArrayOps<QWidget_*>::copyAppend
              (&this->super_Type,local_20,(QWidget **)(((long)e - (long)b) + (long)local_20));
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }